

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_file_handle.cpp
# Opt level: O2

void __thiscall
SplitFixture_Empty_Test<const_unsigned_char>::TestBody
          (SplitFixture_Empty_Test<const_unsigned_char> *this)

{
  TypedExpectation<unsigned_long_(const_void_*,_unsigned_long)> *this_00;
  mock_callback *this_01;
  char *message;
  TypeParam buffer;
  AssertHelper local_88;
  MatcherBase<unsigned_long> local_80;
  size_t size;
  size_t total;
  AssertionResult gtest_ar;
  
  buffer = '\0';
  size = 0;
  testing::Matcher<const_void_*>::Matcher((Matcher<const_void_*> *)&total,&buffer);
  testing::Matcher<unsigned_long>::Matcher((Matcher<unsigned_long> *)&local_80,0);
  this_01 = &(this->super_SplitFixture<const_unsigned_char>).callback;
  anon_unknown.dwarf_7f495::SplitFixture<const_unsigned_char>::mock_callback::gmock_call
            ((MockSpec<unsigned_long_(const_void_*,_unsigned_long)> *)&gtest_ar,this_01,
             (Matcher<const_void_*> *)&total,(Matcher<unsigned_long> *)&local_80);
  testing::internal::GetWithoutMatchers();
  this_00 = testing::internal::MockSpec<unsigned_long_(const_void_*,_unsigned_long)>::
            InternalExpectedAt((MockSpec<unsigned_long_(const_void_*,_unsigned_long)> *)&gtest_ar,
                               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/os/test_file_handle.cpp"
                               ,0x34,"this->callback","call (&buffer, size)");
  testing::internal::TypedExpectation<unsigned_long_(const_void_*,_unsigned_long)>::Times(this_00,0)
  ;
  std::_Tuple_impl<0UL,_testing::Matcher<const_void_*>,_testing::Matcher<unsigned_long>_>::
  ~_Tuple_impl((_Tuple_impl<0UL,_testing::Matcher<const_void_*>,_testing::Matcher<unsigned_long>_> *
               )&gtest_ar.message_);
  testing::internal::MatcherBase<unsigned_long>::~MatcherBase(&local_80);
  testing::internal::MatcherBase<const_void_*>::~MatcherBase((MatcherBase<const_void_*> *)&total);
  total = pstore::file::details::
          split<unsigned_short,unsigned_char_const,(anonymous_namespace)::SplitFixture<unsigned_char_const>::mock_callback>
                    (&buffer,0,this_01);
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)&gtest_ar,"size","total",&size,&total);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_80);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      message = "";
    }
    else {
      message = *(char **)gtest_ar.message_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/os/test_file_handle.cpp"
               ,0x38,message);
    testing::internal::AssertHelper::operator=(&local_88,(Message *)&local_80);
    testing::internal::AssertHelper::~AssertHelper(&local_88);
    if (local_80.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface !=
        (_func_int **)0x0) {
      (**(code **)(*local_80.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface + 8))()
      ;
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  return;
}

Assistant:

TYPED_TEST (SplitFixture, Empty) {
    TypeParam buffer{};
    constexpr std::size_t size{0};
    EXPECT_CALL (this->callback, call (&buffer, size)).Times (0);

    using pstore::file::details::split;
    std::size_t const total = split<std::uint16_t> (&buffer, size, this->callback);
    EXPECT_EQ (size, total);
}